

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O0

void __thiscall ftxui::ScreenInteractive::Draw(ScreenInteractive *this,Component *component)

{
  element_type *peVar1;
  element_type *peVar2;
  Dimensions DVar3;
  int *piVar4;
  ostream *poVar5;
  size_type __n;
  size_type __n_00;
  bool local_331;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  int local_168;
  int local_164;
  int dy;
  int dx;
  allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_> local_13a;
  allocator<ftxui::Pixel> local_139;
  vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_> local_138;
  vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
  local_120;
  string local_108;
  bool local_e1;
  undefined1 local_e0 [7];
  bool resized;
  Requirement local_b4;
  Dimensions local_88;
  Dimensions terminal;
  int local_78;
  Requirement local_70;
  Dimensions local_44;
  int local_30;
  int local_2c;
  int dimy;
  int dimx;
  Element document;
  Component *component_local;
  ScreenInteractive *this_local;
  
  document.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)component;
  peVar1 = std::__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
  (*peVar1->_vptr_ComponentBase[2])(&dimy);
  local_2c = 0;
  local_30 = 0;
  switch(this->dimension_) {
  case FitComponent:
    local_88 = Terminal::Size();
    peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&dimy);
    (*peVar2->_vptr_Node[2])();
    peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&dimy);
    Node::requirement(&local_b4,peVar2);
    piVar4 = std::min<int>(&local_b4.min_x,&local_88.dimx);
    local_2c = *piVar4;
    peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&dimy);
    Node::requirement((Requirement *)local_e0,peVar2);
    piVar4 = std::min<int>((int *)(local_e0 + 4),&local_88.dimy);
    local_30 = *piVar4;
    break;
  case Fixed:
    local_2c = (this->super_Screen).dimx_;
    local_30 = (this->super_Screen).dimy_;
    break;
  case Fullscreen:
    DVar3 = Terminal::Size();
    local_78 = DVar3.dimx;
    local_2c = local_78;
    terminal = Terminal::Size();
    local_30 = terminal.dimy;
    break;
  case TerminalOutput:
    peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&dimy);
    (*peVar2->_vptr_Node[2])();
    local_44 = Terminal::Size();
    local_2c = local_44.dimx;
    peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&dimy);
    Node::requirement(&local_70,peVar2);
    local_30 = local_70.min_y;
  }
  local_331 = true;
  if (local_2c == (this->super_Screen).dimx_) {
    local_331 = local_30 != (this->super_Screen).dimy_;
  }
  local_e1 = local_331;
  poVar5 = std::operator<<((ostream *)&std::cout,(string *)&this->reset_cursor_position);
  Screen::ResetPosition_abi_cxx11_(&local_108,&this->super_Screen,(bool)(local_e1 & 1));
  std::operator<<(poVar5,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  if ((local_e1 & 1U) != 0) {
    (this->super_Screen).dimx_ = local_2c;
    (this->super_Screen).dimy_ = local_30;
    __n = (size_type)local_30;
    __n_00 = (size_type)local_2c;
    std::allocator<ftxui::Pixel>::allocator(&local_139);
    std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::vector(&local_138,__n_00,&local_139);
    std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>::allocator(&local_13a)
    ;
    std::
    vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ::vector(&local_120,__n,&local_138,&local_13a);
    std::
    vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ::operator=(&(this->super_Screen).pixels_,&local_120);
    std::
    vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ::~vector(&local_120);
    std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>::~allocator
              (&local_13a);
    std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::~vector(&local_138);
    std::allocator<ftxui::Pixel>::~allocator(&local_139);
    (this->super_Screen).cursor_.x = (this->super_Screen).dimx_ + -1;
    (this->super_Screen).cursor_.y = (this->super_Screen).dimy_ + -1;
  }
  Draw::i = Draw::i + 1;
  if (((this->use_alternative_screen_ & 1U) == 0) && (Draw::i % 0x14 == 0)) {
    (anonymous_namespace)::DeviceStatusReport_abi_cxx11_
              ((string *)&dy,(_anonymous_namespace_ *)0x6,0);
    std::operator<<((ostream *)&std::cout,(string *)&dy);
    std::__cxx11::string::~string((string *)&dy);
  }
  ftxui::Render(&this->super_Screen,(Element *)&dimy);
  std::__cxx11::string::operator=((string *)&this->set_cursor_position,"");
  std::__cxx11::string::operator=((string *)&this->reset_cursor_position,"");
  local_164 = ((this->super_Screen).dimx_ + -1) - (this->super_Screen).cursor_.x;
  local_168 = ((this->super_Screen).dimy_ + -1) - (this->super_Screen).cursor_.y;
  if (local_164 != 0) {
    std::__cxx11::to_string(&local_1c8,local_164);
    std::operator+(&local_1a8,"\x1b[",&local_1c8);
    std::operator+(&local_188,&local_1a8,"D");
    std::__cxx11::string::operator+=((string *)&this->set_cursor_position,(string *)&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::to_string(&local_228,local_164);
    std::operator+(&local_208,"\x1b[",&local_228);
    std::operator+(&local_1e8,&local_208,"C");
    std::__cxx11::string::operator+=((string *)&this->reset_cursor_position,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
  }
  if (local_168 != 0) {
    std::__cxx11::to_string(&local_288,local_168);
    std::operator+(&local_268,"\x1b[",&local_288);
    std::operator+(&local_248,&local_268,"A");
    std::__cxx11::string::operator+=((string *)&this->set_cursor_position,(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::to_string(&local_2e8,local_168);
    std::operator+(&local_2c8,"\x1b[",&local_2e8);
    std::operator+(&local_2a8,&local_2c8,"B");
    std::__cxx11::string::operator+=((string *)&this->reset_cursor_position,(string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
  }
  std::shared_ptr<ftxui::Node>::~shared_ptr((shared_ptr<ftxui::Node> *)&dimy);
  return;
}

Assistant:

void ScreenInteractive::Draw(Component component) {
  auto document = component->Render();
  int dimx = 0;
  int dimy = 0;
  switch (dimension_) {
    case Dimension::Fixed:
      dimx = dimx_;
      dimy = dimy_;
      break;
    case Dimension::TerminalOutput:
      document->ComputeRequirement();
      dimx = Terminal::Size().dimx;
      dimy = document->requirement().min_y;
      break;
    case Dimension::Fullscreen:
      dimx = Terminal::Size().dimx;
      dimy = Terminal::Size().dimy;
      break;
    case Dimension::FitComponent:
      auto terminal = Terminal::Size();
      document->ComputeRequirement();
      dimx = std::min(document->requirement().min_x, terminal.dimx);
      dimy = std::min(document->requirement().min_y, terminal.dimy);
      break;
  }

  bool resized = (dimx != dimx_) || (dimy != dimy_);
  std::cout << reset_cursor_position << ResetPosition(/*clear=*/resized);

  // Resize the screen if needed.
  if (resized) {
    dimx_ = dimx;
    dimy_ = dimy;
    pixels_ = std::vector<std::vector<Pixel>>(dimy, std::vector<Pixel>(dimx));
    cursor_.x = dimx_ - 1;
    cursor_.y = dimy_ - 1;
  }

  // Periodically request the terminal emulator the frame position relative to
  // the screen. This is useful for converting mouse position reported in
  // screen's coordinates to frame's coordinates.
  static constexpr int cursor_refresh_rate =
#if defined(FTXUI_MICROSOFT_TERMINAL_FALLBACK)
      // Microsoft's terminal suffers from a [bug]. When reporting the cursor
      // position, several output sequences are mixed together into garbage.
      // This causes FTXUI user to see some "1;1;R" sequences into the Input
      // component. See [issue]. Solution is to request cursor position less
      // often. [bug]: https://github.com/microsoft/terminal/pull/7583 [issue]:
      // https://github.com/ArthurSonzogni/FTXUI/issues/136
      150;
#else
      20;
#endif
  static int i = -3;
  ++i;
  if (!use_alternative_screen_ && (i % cursor_refresh_rate == 0))
    std::cout << DeviceStatusReport(DSRMode::kCursor);

  Render(*this, document);

  // Set cursor position for user using tools to insert CJK characters.
  set_cursor_position = "";
  reset_cursor_position = "";

  int dx = dimx_ - 1 - cursor_.x;
  int dy = dimy_ - 1 - cursor_.y;

  if (dx != 0) {
    set_cursor_position += "\x1B[" + std::to_string(dx) + "D";
    reset_cursor_position += "\x1B[" + std::to_string(dx) + "C";
  }
  if (dy != 0) {
    set_cursor_position += "\x1B[" + std::to_string(dy) + "A";
    reset_cursor_position += "\x1B[" + std::to_string(dy) + "B";
  }
}